

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::end_primitive
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  string shaderSource_00;
  bool bVar1;
  char *__s;
  long *plVar2;
  size_type *psVar3;
  long lVar4;
  ShaderFunction function;
  string shaderSource;
  undefined8 in_stack_ffffffffffffff68;
  _Alloc_hider _Var5;
  size_type sVar6;
  undefined8 in_stack_ffffffffffffff80;
  undefined8 uVar7;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  _Var5._M_p = &stack0xffffffffffffff80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffffff70,"EndPrimitieve.","");
  NegativeTestContext::beginSection(ctx,(string *)&stack0xffffffffffffff70);
  if (_Var5._M_p != &stack0xffffffffffffff80) {
    operator_delete(_Var5._M_p,in_stack_ffffffffffffff80 + 1);
  }
  lVar4 = 0;
  do {
    shaderType = *(ShaderType *)((long)&(anonymous_namespace)::s_shaders + lVar4);
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if ((lVar4 != 8) && (bVar1)) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_50,__s,(allocator<char> *)&stack0xffffffffffffff6f);
      function = SHADER_FUNCTION_END_PRIMITIVE;
      plVar2 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x99df33);
      psVar3 = (size_type *)(plVar2 + 2);
      if ((size_type *)*plVar2 == psVar3) {
        uVar7 = *psVar3;
        _Var5._M_p = &stack0xffffffffffffff80;
      }
      else {
        uVar7 = *psVar3;
        _Var5._M_p = (pointer)*plVar2;
      }
      sVar6 = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      NegativeTestContext::beginSection(ctx,(string *)&stack0xffffffffffffff70);
      if (_Var5._M_p != &stack0xffffffffffffff80) {
        operator_delete(_Var5._M_p,uVar7 + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      (anonymous_namespace)::genShaderSourceGeometry_abi_cxx11_
                ((string *)&stack0xffffffffffffff70,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0xf,function);
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char*>((string *)local_70,_Var5._M_p,_Var5._M_p + sVar6);
      shaderSource_00._M_string_length = (size_type)_Var5._M_p;
      shaderSource_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff68;
      shaderSource_00.field_2._M_allocated_capacity = sVar6;
      shaderSource_00.field_2._8_8_ = uVar7;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_70[0],shaderSource_00);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      NegativeTestContext::endSection(ctx);
      if (_Var5._M_p != &stack0xffffffffffffff80) {
        operator_delete(_Var5._M_p,uVar7 + 1);
      }
    }
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x18);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void end_primitive (NegativeTestContext& ctx)
{
	ctx.beginSection("EndPrimitieve.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			if (s_shaders[shaderNdx] == glu::SHADERTYPE_GEOMETRY)
				continue;

			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			const std::string shaderSource =	genShaderSourceGeometry(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_END_PRIMITIVE);
			verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			ctx.endSection();
		}
	}
	ctx.endSection();
}